

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnetfil.cpp
# Opt level: O0

int CVmNetFile::exists(char *fname,int sfid)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  int in_ESI;
  char *in_RDI;
  int ret;
  CVmNetFile *nf;
  char *in_stack_00000138;
  char *in_stack_00000140;
  
  iVar1 = open(in_RDI,in_ESI,0,0xb,0);
  iVar2 = is_net_file((CVmNetFile *)CONCAT44(extraout_var,iVar1));
  if (iVar2 == 0) {
    iVar1 = access(((CVmNetFile *)CONCAT44(extraout_var,iVar1))->lclfname,0);
    uVar3 = (uint)((iVar1 != 0 ^ 0xffU) & 1);
  }
  else {
    uVar3 = server_file_check(in_stack_00000140,in_stack_00000138);
  }
  abandon((CVmNetFile *)CONCAT44(uVar3,uVar3));
  return uVar3;
}

Assistant:

int CVmNetFile::exists(VMG_ const char *fname, int sfid)
{
    /* create a no-op descriptor for the file */
    CVmNetFile *nf = open(vmg_ fname, sfid, 0, OSFTUNK, 0);

    /* 
     *   if it's a network file, check with the server; otherwise check the
     *   local file system 
     */
    int ret = (nf->is_net_file()
               ? server_file_check(vmg_ nf->srvfname, "R")
               : !osfacc(nf->lclfname));

    /* done with the descriptor */
    nf->abandon(vmg0_);

    /* return the result */
    return ret;
}